

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.h
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3443::GetSubBlockOffset(ChElementShellANCF_3443 *this)

{
  return;
}

Assistant:

virtual unsigned int GetSubBlockOffset(int nblock) override { return m_nodes[nblock]->NodeGetOffset_w(); }